

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrLib.h
# Opt level: O2

void __thiscall nv::String::allocString(String *this,char *str,int len)

{
  undefined2 *puVar1;
  
  puVar1 = (undefined2 *)mem::malloc((long)(len + 3));
  this->data = (char *)(puVar1 + 1);
  *puVar1 = 0;
  strncpy((char *)(puVar1 + 1),str,(long)len);
  this->data[len] = '\0';
  return;
}

Assistant:

void allocString(const char * str, int len)
		{
			const char * ptr = static_cast<const char *>(mem::malloc(2 + len + 1));
	
			setData( ptr );				
			setRefCount( 0 );
			
			// Copy string.
			strCpy(const_cast<char *>(data), len+1, str, len);

			// Add terminating character.
			const_cast<char *>(data)[len] = '\0';
		}